

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::lookingAtLookupToken(SelectionCompiler *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  
  iVar2 = this->ichToken;
  iVar3 = this->cchScript;
  if (iVar2 == iVar3) goto LAB_0026b4ae;
  iVar8 = iVar2 + 1;
  pcVar4 = (this->script)._M_dataplus._M_p;
  bVar1 = pcVar4[iVar2];
  iVar9 = iVar8;
  if (bVar1 < 0x28) {
    if (bVar1 == 0x21) {
LAB_0026b426:
      if ((iVar8 < iVar3) && (pcVar4[iVar8] == '=')) {
        iVar9 = iVar2 + 2;
      }
      goto LAB_0026b4a4;
    }
    if (bVar1 != 0x26) goto LAB_0026b443;
LAB_0026b402:
    if ((iVar8 < iVar3) && (pcVar4[iVar8] == bVar1)) {
      iVar9 = iVar2 + 2;
    }
  }
  else {
    uVar7 = (ulong)(bVar1 - 0x28);
    if (bVar1 - 0x28 < 0x36) {
      if ((0x28000000000013U >> (uVar7 & 0x3f) & 1) == 0) {
        if ((0x700000UL >> (uVar7 & 0x3f) & 1) == 0) {
          if (uVar7 == 7) goto LAB_0026b426;
          goto LAB_0026b43e;
        }
        if ((iVar8 < iVar3) && ((byte)(pcVar4[iVar8] - 0x3cU) < 3)) {
          iVar9 = iVar2 + 2;
        }
      }
    }
    else {
LAB_0026b43e:
      if (bVar1 == 0x7c) goto LAB_0026b402;
LAB_0026b443:
      if (iVar8 < iVar3) {
        pbVar10 = (byte *)(pcVar4 + iVar8);
        do {
          bVar1 = *pbVar10;
          iVar11 = (int)(char)bVar1;
          iVar5 = isspace(iVar11);
          iVar9 = iVar8;
          if ((iVar5 != 0) ||
             ((iVar5 = isalpha(iVar11), 9 < iVar11 - 0x30U && iVar5 == 0 &&
              ((uVar6 = bVar1 - 0x2a, 0x35 < uVar6 ||
               ((0x2a00000020001bU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))))) break;
          iVar8 = iVar8 + 1;
          pbVar10 = pbVar10 + 1;
          iVar9 = iVar3;
        } while (iVar3 != iVar8);
      }
    }
  }
LAB_0026b4a4:
  this->cchToken = iVar9 - iVar2;
LAB_0026b4ae:
  return iVar2 != iVar3;
}

Assistant:

bool SelectionCompiler::lookingAtLookupToken() {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    char ch;
    switch (ch = script[ichT++]) {
    case '(':
    case ')':
    case ',':
    case '[':
    case ']':
      break;
    case '&':
    case '|':
      if (ichT < cchScript && script[ichT] == ch) { ++ichT; }
      break;
    case '<':
    case '=':
    case '>':
      if (ichT < cchScript &&
          ((ch = script[ichT]) == '<' || ch == '=' || ch == '>')) {
        ++ichT;
      }
      break;
    case '/':
    case '!':
      if (ichT < cchScript && script[ichT] == '=') { ++ichT; }
      break;
    default:
      if ((ch < 'a' || ch > 'z') && (ch < 'A' && ch > 'Z') && ch != '_') {
        return false;
      }
      [[fallthrough]];
    case '*':
    case '?':  // include question marks in identifier for atom expressions
      while (ichT < cchScript && !std::isspace(ch = script[ichT]) &&
             (std::isalpha(ch) || std::isdigit(ch) || ch == '_' || ch == '.' ||
              ch == '*' || ch == '?' || ch == '+' || ch == '-' || ch == '[' ||
              ch == ']')) {
        ++ichT;
      }
      break;
    }

    cchToken = ichT - ichToken;

    return true;
  }